

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  long *plVar1;
  int local_1c;
  
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    local_1c = 5;
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x18),output);
    local_1c = 4;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  plVar1 = (long *)(*(long *)(this + 0x10) + 0x70);
  if (*(long *)(this + 0x18) != 0) {
    plVar1 = (long *)(*(long *)(this + 0x18) + 0x40);
  }
  local_1c = (int)(((long)this - *plVar1) / 0x50);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}